

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

void __thiscall
libtorrent::scrape_failed_alert::scrape_failed_alert
          (scrape_failed_alert *this,stack_allocator *alloc,torrent_handle *h,endpoint *ep,
          string_view u,error_code *e)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  undefined3 uVar4;
  string local_30;
  
  tracker_alert::tracker_alert(&this->super_tracker_alert,alloc,h,ep,u);
  (this->super_tracker_alert).super_torrent_alert.super_alert._vptr_alert =
       (_func_int **)&PTR__scrape_failed_alert_004309d8;
  bVar3 = e->failed_;
  uVar4 = *(undefined3 *)&e->field_0x5;
  uVar1 = *(undefined4 *)&e->cat_;
  uVar2 = *(undefined4 *)((long)&e->cat_ + 4);
  (this->error).val_ = e->val_;
  (this->error).failed_ = bVar3;
  *(undefined3 *)&(this->error).field_0x5 = uVar4;
  *(undefined4 *)&(this->error).cat_ = uVar1;
  *(undefined4 *)((long)&(this->error).cat_ + 4) = uVar2;
  (this->m_msg_idx).m_idx = -1;
  (*e->cat_->_vptr_error_category[4])(&local_30,e->cat_,(ulong)(uint)e->val_);
  convert_from_native(&this->msg,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

scrape_failed_alert::scrape_failed_alert(aux::stack_allocator& alloc
		, torrent_handle const& h, tcp::endpoint const& ep
		, string_view u, error_code const& e)
		: tracker_alert(alloc, h, ep, u)
		, error(e)
		, m_msg_idx()
#if TORRENT_ABI_VERSION == 1
		, msg(convert_from_native(e.message()))
#endif
	{
		TORRENT_ASSERT(!u.empty());
	}